

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O1

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int,_double>_>::kernel
          (kernel<bool,_cppjit::detail::pack<int,_double>_> *this,string *kernel_name)

{
  pointer pcVar1;
  undefined1 local_29;
  gcc *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->kernel_name)._M_dataplus._M_p = (pointer)&(this->kernel_name).field_2;
  pcVar1 = (kernel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + kernel_name->_M_string_length);
  local_28 = (gcc *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppjit::builder::gcc,std::allocator<cppjit::builder::gcc>,std::__cxx11::string_const&>
            (&local_20,&local_28,(allocator<cppjit::builder::gcc> *)&local_29,kernel_name);
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28->super_builder;
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  *(undefined8 *)&(this->kernel_implementation).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->kernel_implementation).super__Function_base._M_functor + 8) = 0;
  (this->kernel_implementation).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->kernel_implementation)._M_invoker = (_Invoker_type)0x0;
  this->verbose = false;
  return;
}

Assistant:

kernel(const std::string &kernel_name)
      : kernel_name(kernel_name),
        builder(std::make_shared<cppjit::builder::gcc>(kernel_name)),
        verbose(false) {}